

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.cpp
# Opt level: O0

string * __thiscall
crawler::TokenQueue::consumeElementSelector_abi_cxx11_
          (string *__return_storage_ptr__,TokenQueue *this)

{
  TokenQueue *this_local;
  
  consumeByPredicate<crawler::TokenQueue::consumeElementSelector[abi:cxx11]()::__0>
            (__return_storage_ptr__,this,(anon_class_8_1_8991fb9c)this);
  return __return_storage_ptr__;
}

Assistant:

std::string crawler::TokenQueue::consumeElementSelector() {
  return consumeByPredicate([this]() -> bool {
    return matchesAny(std::array<std::string, 4>({"*|", "|", "_", "-"}));
  });
}